

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

void Curl_hsts_loadfiles(Curl_easy *data)

{
  Curl_easy *data_00;
  curl_slist *pcVar1;
  
  pcVar1 = (data->state).hstslist;
  if (pcVar1 != (curl_slist *)0x0) {
    data_00 = data;
    Curl_share_lock(data,CURL_LOCK_DATA_HSTS,CURL_LOCK_ACCESS_SINGLE);
    for (; pcVar1 != (curl_slist *)0x0; pcVar1 = pcVar1->next) {
      Curl_hsts_loadfile(data_00,data->hsts,pcVar1->data);
    }
    Curl_share_unlock(data,CURL_LOCK_DATA_HSTS);
    return;
  }
  return;
}

Assistant:

void Curl_hsts_loadfiles(struct Curl_easy *data)
{
  struct curl_slist *l = data->state.hstslist;
  if(l) {
    Curl_share_lock(data, CURL_LOCK_DATA_HSTS, CURL_LOCK_ACCESS_SINGLE);

    while(l) {
      (void)Curl_hsts_loadfile(data, data->hsts, l->data);
      l = l->next;
    }
    Curl_share_unlock(data, CURL_LOCK_DATA_HSTS);
  }
}